

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spmd.cc
# Opt level: O2

void __thiscall bsplib::Spmd::Spmd(Spmd *this,int nprocs)

{
  int world_pid;
  int nprocs_local;
  int mpi_init;
  
  world_pid = -1;
  nprocs_local = nprocs;
  MPI_Initialized(&mpi_init);
  if (mpi_init != 0) {
    MPI_Bcast(&nprocs_local,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
    MPI_Comm_rank(&ompi_mpi_comm_world,&world_pid);
    this->m_closed = false;
    this->m_active = world_pid < nprocs_local;
    MPI_Comm_split(&ompi_mpi_comm_world,world_pid < nprocs_local,world_pid,this);
    MPI_Comm_size(this->m_comm,&this->m_nprocs);
    MPI_Comm_rank(this->m_comm,&this->m_pid);
    clock_gettime(1,(timespec *)&this->m_time);
    return;
  }
  __assert_fail("mpi_init",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/spmd.cc"
                ,0xd,"bsplib::Spmd::Spmd(int)");
}

Assistant:

Spmd :: Spmd( int nprocs ) 
{
    int mpi_init;
    int world_pid = -1;
    
    MPI_Initialized(&mpi_init);
    assert( mpi_init );
    MPI_Bcast( &nprocs, 1, MPI_INT, 0, MPI_COMM_WORLD );

    MPI_Comm_rank( MPI_COMM_WORLD, & world_pid );
    m_closed = false;
    m_active = world_pid < nprocs;
    MPI_Comm_split( MPI_COMM_WORLD, m_active, world_pid, &m_comm );

    MPI_Comm_size( m_comm, &m_nprocs );
    MPI_Comm_rank( m_comm, &m_pid );

#ifdef HAS_CLOCK_GETTIME
    clock_gettime( CLOCK_MONOTONIC, &m_time );
#else
    m_time = MPI_Wtime();
#endif
}